

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O0

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Mat *in_stack_ffffffffffffff30;
  Mat *in_stack_ffffffffffffff38;
  Mat *this_00;
  undefined1 local_b8 [48];
  Mat local_88;
  Mat local_48;
  int local_4;
  
  if ((int)in_RDI[2].cstep == 0) {
    if (in_RDI[2].c == 0) {
      if (in_RDI[2].h == 0) {
        Mat::create(in_RDI,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                    (size_t)in_stack_ffffffffffffff30);
      }
      else {
        (**(code **)*in_RSI)(local_b8,in_RSI,in_RDI[2].h,1,in_R8,in_R9,local_b8);
        Mat::operator=(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        Mat::~Mat((Mat *)0x11b32f);
      }
    }
    else {
      in_stack_ffffffffffffff30 = &local_88;
      (**(code **)(*in_RSI + 8))(in_stack_ffffffffffffff30,in_RSI,in_RDI[2].h,in_RDI[2].c,1);
      Mat::operator=(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      Mat::~Mat((Mat *)0x11b2af);
    }
  }
  else {
    this_00 = &local_48;
    (**(code **)(*in_RSI + 0x10))(this_00,in_RSI,in_RDI[2].h,in_RDI[2].c,(int)in_RDI[2].cstep,1);
    Mat::operator=(this_00,in_stack_ffffffffffffff30);
    Mat::~Mat((Mat *)0x11b222);
  }
  bVar1 = Mat::empty(in_stack_ffffffffffffff30);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}